

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::WriteMemoryRequest>::copyConstruct
          (BasicTypeInfo<dap::WriteMemoryRequest> *this,void *dst,void *src)

{
  *(undefined1 *)dst = *src;
  *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)src + 1);
  *(long *)((long)dst + 8) = (long)dst + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 8),*(long *)((long)src + 8),
             *(long *)((long)src + 0x10) + *(long *)((long)src + 8));
  *(long *)((long)dst + 0x28) = (long)dst + 0x38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x28),*(long *)((long)src + 0x28),
             *(long *)((long)src + 0x30) + *(long *)((long)src + 0x28));
  *(undefined8 *)((long)dst + 0x48) = *(undefined8 *)((long)src + 0x48);
  *(undefined1 *)((long)dst + 0x50) = *(undefined1 *)((long)src + 0x50);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }